

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O1

void ssdp_event_handler_thread(void *the_data)

{
  parse_status_t pVar1;
  int iVar2;
  http_header_t *phVar3;
  ulong uVar4;
  memptr mStack_18;
  
  pVar1 = parser_parse((http_parser_t *)the_data);
  if (pVar1 != PARSE_SUCCESS) {
    if (pVar1 == PARSE_FAILURE) {
      if ((*(int *)((long)the_data + 4) == 8) && (*(int *)((long)the_data + 0x1b4) != 0))
      goto LAB_0011edcb;
      iVar2 = 0x2f0;
      uVar4 = 3;
    }
    else {
      iVar2 = 0x2fb;
      uVar4 = (ulong)pVar1;
    }
    UpnpPrintf(UPNP_INFO,SSDP,".upnp/src/ssdp/ssdp_server.c",iVar2,"SSDP recvd bad msg code = %d\n",
               uVar4);
    goto LAB_0011ee58;
  }
LAB_0011edcb:
  if (((*(uint *)((long)the_data + 4) & 0xfffffffe) != 8) && (*(int *)((long)the_data + 0xd8) != 9))
  goto LAB_0011ee58;
  if (*(int *)((long)the_data + 0xd8) != 9) {
    if (*(int *)((long)the_data + 8) != 1) goto LAB_0011ee58;
    iVar2 = strncmp("*",*(char **)((long)the_data + 0x28),*(size_t *)((long)the_data + 0x30));
    if (iVar2 != 0) goto LAB_0011ee58;
    phVar3 = httpmsg_find_hdr((http_message_t *)the_data,7,&mStack_18);
    if (phVar3 == (http_header_t *)0x0) {
LAB_0011ef19:
      UpnpPrintf(UPNP_INFO,SSDP,".upnp/src/ssdp/ssdp_server.c",0x2ce,
                 "Invalid HOST header from SSDP message\n");
      goto LAB_0011ee58;
    }
    iVar2 = memptr_cmp(&mStack_18,"239.255.255.250:1900");
    if (iVar2 != 0) {
      iVar2 = memptr_cmp(&mStack_18,"[FF02::C]:1900");
      if (iVar2 != 0) {
        iVar2 = memptr_cmp(&mStack_18,"[ff02::c]:1900");
        if (iVar2 != 0) {
          iVar2 = memptr_cmp(&mStack_18,"[FF05::C]:1900");
          if (iVar2 != 0) {
            iVar2 = memptr_cmp(&mStack_18,"[ff05::c]:1900");
            if (iVar2 != 0) goto LAB_0011ef19;
          }
        }
      }
    }
  }
  if ((*(int *)((long)the_data + 4) == 8) || (*(int *)((long)the_data + 0xd8) == 9)) {
    ssdp_handle_ctrlpt_msg
              ((http_message_t *)the_data,(sockaddr_storage *)((long)the_data + 0x1f0),0);
  }
  else {
    ssdp_handle_device_request
              ((http_message_t *)the_data,(sockaddr_storage *)((long)the_data + 0x1f0));
  }
LAB_0011ee58:
  if (the_data != (void *)0x0) {
    httpmsg_destroy((http_message_t *)the_data);
    free(the_data);
  }
  return;
}

Assistant:

static void ssdp_event_handler_thread(
	/*! [] ssdp_thread_data structure. This structure contains SSDP
	 * request message. */
	void *the_data)
{
	ssdp_thread_data *data = (ssdp_thread_data *)the_data;
	http_message_t *hmsg = &data->parser.msg;

	if (start_event_handler(the_data) != 0)
		return;
	/* send msg to device or ctrlpt */
	if (hmsg->method == (http_method_t)HTTPMETHOD_NOTIFY ||
		hmsg->request_method == (http_method_t)HTTPMETHOD_MSEARCH) {
	#ifdef INCLUDE_CLIENT_APIS
		ssdp_handle_ctrlpt_msg(hmsg, &data->dest_addr, 0);
	#endif /* INCLUDE_CLIENT_APIS */
	} else {
		ssdp_handle_device_request(hmsg, &data->dest_addr);
	}

	/* free data */
	free_ssdp_event_handler_data(data);
}